

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_teamcity.hpp
# Opt level: O2

void __thiscall
Catch::TeamCityReporter::testCaseEnded(TeamCityReporter *this,TestCaseStats *testCaseStats)

{
  ostream *poVar1;
  string local_60;
  string local_40;
  
  LazyStat<Catch::TestCaseInfo>::reset
            (&(this->super_StreamingReporterBase<Catch::TeamCityReporter>).currentTestCaseInfo);
  if ((testCaseStats->stdOut)._M_string_length != 0) {
    poVar1 = std::operator<<((ostream *)
                             (this->super_StreamingReporterBase<Catch::TeamCityReporter>).stream,
                             "##teamcity[testStdOut name=\'");
    escape(&local_60,&(testCaseStats->testInfo).name);
    poVar1 = std::operator<<(poVar1,(string *)&local_60);
    poVar1 = std::operator<<(poVar1,"\' out=\'");
    escape(&local_40,&testCaseStats->stdOut);
    poVar1 = std::operator<<(poVar1,(string *)&local_40);
    std::operator<<(poVar1,"\']\n");
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  if ((testCaseStats->stdErr)._M_string_length != 0) {
    poVar1 = std::operator<<((ostream *)
                             (this->super_StreamingReporterBase<Catch::TeamCityReporter>).stream,
                             "##teamcity[testStdErr name=\'");
    escape(&local_60,&(testCaseStats->testInfo).name);
    poVar1 = std::operator<<(poVar1,(string *)&local_60);
    poVar1 = std::operator<<(poVar1,"\' out=\'");
    escape(&local_40,&testCaseStats->stdErr);
    poVar1 = std::operator<<(poVar1,(string *)&local_40);
    std::operator<<(poVar1,"\']\n");
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::TeamCityReporter>).stream,
                           "##teamcity[testFinished name=\'");
  escape(&local_60,&(testCaseStats->testInfo).name);
  poVar1 = std::operator<<(poVar1,(string *)&local_60);
  poVar1 = std::operator<<(poVar1,"\' duration=\'");
  Timer::getElapsedMilliseconds(&this->m_testTimer);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\']\n");
  std::__cxx11::string::~string((string *)&local_60);
  std::ostream::flush();
  return;
}

Assistant:

void testCaseEnded( TestCaseStats const& testCaseStats ) override {
            StreamingReporterBase::testCaseEnded( testCaseStats );
            if( !testCaseStats.stdOut.empty() )
                stream << "##teamcity[testStdOut name='"
                    << escape( testCaseStats.testInfo.name )
                    << "' out='" << escape( testCaseStats.stdOut ) << "']\n";
            if( !testCaseStats.stdErr.empty() )
                stream << "##teamcity[testStdErr name='"
                    << escape( testCaseStats.testInfo.name )
                    << "' out='" << escape( testCaseStats.stdErr ) << "']\n";
            stream << "##teamcity[testFinished name='"
                    << escape( testCaseStats.testInfo.name ) << "' duration='"
                    << m_testTimer.getElapsedMilliseconds() << "']\n";
            stream.flush();
        }